

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O3

HelicsTranslator
helicsCoreRegisterTranslator(HelicsCore cr,HelicsTranslatorTypes type,char *name,HelicsError *err)

{
  int iVar1;
  Translator *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> *puVar3;
  ulong uVar4;
  Core *pCVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  size_t sVar7;
  Translator *this_00;
  ulong uVar8;
  pointer *__ptr;
  const_iterator __position;
  _Alloc_hider _Var9;
  TranslatorObject *pTVar10;
  CoreObject *coreObj;
  string_view translatorName;
  TranslatorObject *local_58;
  _Head_base<0UL,_helics::TranslatorObject_*,_false> local_50;
  Core *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  HelicsError *local_38;
  
  local_38 = err;
  getCoreSharedPtr(&local_48,(HelicsError *)cr);
  pCVar5 = local_48;
  if (local_48 == (Core *)0x0) {
    pTVar10 = (TranslatorObject *)0x0;
  }
  else {
    local_58 = (TranslatorObject *)operator_new(0x38);
    (local_58->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_58->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (local_58->mTrans)._M_t.
    super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>._M_t.
    super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>.
    super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl = (Translator *)0x0;
    (local_58->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58->custom = false;
    *(undefined3 *)&local_58->field_0x1 = 0;
    local_58->valid = 0;
    local_58->transPtr = (Translator *)0x0;
    (local_58->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sVar7 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var9 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (name != (char *)0x0) {
      sVar7 = strlen(name);
      _Var9._M_p = name;
    }
    this_00 = (Translator *)operator_new(0x50);
    translatorName._M_str = _Var9._M_p;
    translatorName._M_len = sVar7;
    helics::Translator::Translator(this_00,pCVar5,translatorName);
    pTVar2 = (local_58->mTrans)._M_t.
             super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>.
             _M_t.
             super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>.
             super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl;
    (local_58->mTrans)._M_t.
    super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>._M_t.
    super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>.
    super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl = this_00;
    if (pTVar2 != (Translator *)0x0) {
      (**(code **)((long)(pTVar2->super_Interface)._vptr_Interface + 8))();
      this_00 = (local_58->mTrans)._M_t.
                super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>.
                _M_t.
                super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>
                .super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl;
    }
    helics::Translator::setTranslatorType(this_00,type);
    p_Var6 = p_Stack_40;
    pCVar5 = local_48;
    local_58->transPtr =
         (local_58->mTrans)._M_t.
         super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>._M_t.
         super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>.
         super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl;
    local_48 = (Core *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (local_58->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (local_58->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar5
    ;
    (local_58->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var6;
    pTVar10 = local_58;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      pTVar10 = local_58;
    }
    pTVar10->custom = type == HELICS_TRANSLATOR_TYPE_CUSTOM;
    local_58 = (TranslatorObject *)0x0;
    pTVar10->valid = -0x4c83cad2;
    __position._M_current =
         *(unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> **)
          ((long)cr + 0x28);
    puVar3 = *(unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
               **)((long)cr + 0x30);
    local_50._M_head_impl = pTVar10;
    if ((__position._M_current == puVar3) ||
       (iVar1 = (pTVar10->transPtr->super_Interface).handle.hid,
       ((puVar3[-1]._M_t.
         super___uniq_ptr_impl<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
         ._M_t.
         super__Tuple_impl<0UL,_helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>
         .super__Head_base<0UL,_helics::TranslatorObject_*,_false>._M_head_impl)->transPtr->
       super_Interface).handle.hid < iVar1)) {
      std::
      vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>
      ::
      emplace_back<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>
                ((vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>
                  *)((long)cr + 0x28),
                 (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                  *)&local_50);
    }
    else {
      uVar8 = (long)puVar3 - (long)__position._M_current >> 3;
      while (uVar4 = uVar8, 0 < (long)uVar4) {
        uVar8 = uVar4 >> 1;
        if (((__position._M_current[uVar8]._M_t.
              super___uniq_ptr_impl<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>
              .super__Head_base<0UL,_helics::TranslatorObject_*,_false>._M_head_impl)->transPtr->
            super_Interface).handle.hid <= iVar1) {
          __position._M_current = __position._M_current + uVar8 + 1;
          uVar8 = ~uVar8 + uVar4;
        }
      }
      std::
      vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
                        *)((long)cr + 0x28),__position,(value_type *)&local_50);
    }
    if (local_50._M_head_impl != (TranslatorObject *)0x0) {
      std::default_delete<helics::TranslatorObject>::operator()
                ((default_delete<helics::TranslatorObject> *)&local_50,local_50._M_head_impl);
    }
    local_50._M_head_impl = (TranslatorObject *)0x0;
    if (local_58 != (TranslatorObject *)0x0) {
      std::default_delete<helics::TranslatorObject>::operator()
                ((default_delete<helics::TranslatorObject> *)&local_58,local_58);
    }
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  return pTVar10;
}

Assistant:

HelicsTranslator helicsCoreRegisterTranslator(HelicsCore cr, HelicsTranslatorTypes type, const char* name, HelicsError* err)
{
    auto core = getCoreSharedPtr(cr, err);
    if (!core) {
        return nullptr;
    }
    try {
        auto trans = std::make_unique<helics::TranslatorObject>();

        trans->mTrans = std::make_unique<helics::Translator>(core.get(), AS_STRING_VIEW(name));
        trans->mTrans->setTranslatorType(type);
        trans->transPtr = trans->mTrans.get();
        trans->corePtr = std::move(core);
        trans->custom = (type == HELICS_TRANSLATOR_TYPE_CUSTOM);
        return coreAddTranslator(cr, std::move(trans));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}